

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Decoration __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::TranslateNonUniformDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  bool bVar1;
  TQualifier *qualifier_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar1 = glslang::TQualifier::isNonUniform(qualifier);
  if (bVar1) {
    spv::Builder::addIncorporatedExtension(&this->builder,"SPV_EXT_descriptor_indexing",Spv_1_5);
    spv::Builder::addCapability(&this->builder,CapabilityShaderNonUniform);
    this_local._4_4_ = DecorationNonUniform;
  }
  else {
    this_local._4_4_ = DecorationMax;
  }
  return this_local._4_4_;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateNonUniformDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.isNonUniform()) {
        builder.addIncorporatedExtension("SPV_EXT_descriptor_indexing", spv::Spv_1_5);
        builder.addCapability(spv::CapabilityShaderNonUniformEXT);
        return spv::DecorationNonUniformEXT;
    } else
        return spv::DecorationMax;
}